

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Configuration.cpp
# Opt level: O0

int __thiscall Configuration::getInt(Configuration *this,string *key,int ifEmpty)

{
  bool bVar1;
  int iVar2;
  mapped_type_conflict *pmVar3;
  undefined8 uVar4;
  int in_EDX;
  string *in_RSI;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  string *this_00;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  string local_50 [8];
  key_type *in_stack_ffffffffffffffb8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *in_stack_ffffffffffffffc0;
  _Self local_30;
  _Self local_28;
  int local_1c;
  int local_4;
  
  local_1c = in_EDX;
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
       ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),(key_type *)0x19c99d)
  ;
  local_30._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
              *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  bVar1 = std::operator!=(&local_28,&local_30);
  if (bVar1) {
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::operator[](in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    local_4 = *pmVar3;
  }
  else {
    this_00 = local_50;
    std::__cxx11::string::string(this_00,in_RSI);
    iVar2 = getType((Configuration *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                    (string *)this_00);
    std::__cxx11::string::~string(local_50);
    if (iVar2 == 3) {
      uVar4 = std::__cxx11::string::c_str();
      softHSMLog(4,"getInt",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/common/Configuration.cpp"
                 ,0x71,"Missing %s in configuration. Using default value: 0%o",uVar4,local_1c);
    }
    else {
      uVar4 = std::__cxx11::string::c_str();
      softHSMLog(4,"getInt",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/common/Configuration.cpp"
                 ,0x75,"Missing %s in configuration. Using default value: %i",uVar4,local_1c);
    }
    local_4 = local_1c;
  }
  return local_4;
}

Assistant:

int Configuration::getInt(std::string key, int ifEmpty /* = 0 */)
{
	if (integerConfiguration.find(key) != integerConfiguration.end())
	{
		return integerConfiguration[key];
	}
	else
	{
		if (getType(key) == CONFIG_TYPE_INT_OCTAL)
		{
			WARNING_MSG("Missing %s in configuration. Using default value: 0%o", key.c_str(), ifEmpty);
		}
		else
		{
			WARNING_MSG("Missing %s in configuration. Using default value: %i", key.c_str(), ifEmpty);
		}
		return ifEmpty;
	}
}